

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

void ggml_graph_cpy(ggml_cgraph *src,ggml_cgraph *dst)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  ulong uVar5;
  int iVar6;
  size_t i;
  ulong uVar7;
  
  if (dst->size < src->n_leafs) {
    pcVar4 = "dst->size >= src->n_leafs";
    iVar6 = 0x177b;
  }
  else {
    iVar6 = src->n_nodes;
    if (dst->size < iVar6) {
      pcVar4 = "dst->size >= src->n_nodes";
      iVar6 = 0x177c;
    }
    else {
      uVar1 = (src->visited_hash_set).size;
      if ((dst->visited_hash_set).size < uVar1) {
        pcVar4 = "dst->visited_hash_set.size >= src->visited_hash_set.size";
        iVar6 = 0x177d;
      }
      else {
        dst->n_leafs = src->n_leafs;
        dst->n_nodes = iVar6;
        dst->order = src->order;
        uVar5 = 0;
        uVar7 = (ulong)(uint)src->n_leafs;
        if (src->n_leafs < 1) {
          uVar7 = uVar5;
        }
        for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
          dst->leafs[uVar5] = src->leafs[uVar5];
        }
        uVar5 = 0;
        uVar7 = (ulong)(uint)src->n_nodes;
        if (src->n_nodes < 1) {
          uVar7 = uVar5;
        }
        for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
          dst->nodes[uVar5] = src->nodes[uVar5];
        }
        for (uVar7 = 0; uVar7 < uVar1; uVar7 = uVar7 + 1) {
          if (((src->visited_hash_set).used[uVar7 >> 5] >> ((uint)uVar7 & 0x1f) & 1) != 0) {
            ggml_hash_insert(&dst->visited_hash_set,(src->visited_hash_set).keys[uVar7]);
            uVar1 = (src->visited_hash_set).size;
          }
        }
        if (dst->grads != (ggml_tensor **)0x0) {
          memset(dst->grads,0,(dst->visited_hash_set).size << 3);
          memset(dst->grad_accs,0,(dst->visited_hash_set).size << 3);
        }
        if (src->grads == (ggml_tensor **)0x0) {
          return;
        }
        if (dst->grads == (ggml_tensor **)0x0) {
          pcVar4 = "dst->grads != NULL";
          iVar6 = 0x1797;
        }
        else if (dst->grad_accs == (ggml_tensor **)0x0) {
          pcVar4 = "dst->grad_accs != NULL";
          iVar6 = 0x1798;
        }
        else {
          uVar7 = 0;
          uVar1 = (ulong)(uint)src->n_nodes;
          if (src->n_nodes < 1) {
            uVar1 = uVar7;
          }
          while( true ) {
            if (uVar1 == uVar7) {
              return;
            }
            sVar2 = ggml_hash_find(&src->visited_hash_set,src->nodes[uVar7]);
            sVar3 = ggml_hash_find(&dst->visited_hash_set,dst->nodes[uVar7]);
            if (sVar2 == 0xffffffffffffffff) break;
            if (((src->visited_hash_set).used[sVar2 >> 5] >> ((uint)sVar2 & 0x1f) & 1) == 0) {
              pcVar4 = "ggml_bitset_get(src->visited_hash_set.used, igrad_src)";
              iVar6 = 0x179e;
              goto LAB_001275b0;
            }
            if (sVar3 == 0xffffffffffffffff) {
              pcVar4 = "igrad_dst != GGML_HASHSET_FULL";
              iVar6 = 0x179f;
              goto LAB_001275b0;
            }
            if (((dst->visited_hash_set).used[sVar3 >> 5] >> ((uint)sVar3 & 0x1f) & 1) == 0) {
              pcVar4 = "ggml_bitset_get(dst->visited_hash_set.used, igrad_dst)";
              iVar6 = 0x17a0;
              goto LAB_001275b0;
            }
            dst->grads[sVar3] = src->grads[sVar2];
            dst->grad_accs[sVar3] = src->grad_accs[sVar2];
            uVar7 = uVar7 + 1;
          }
          pcVar4 = "igrad_src != GGML_HASHSET_FULL";
          iVar6 = 0x179d;
        }
      }
    }
  }
LAB_001275b0:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c",
             iVar6,"GGML_ASSERT(%s) failed",pcVar4);
}

Assistant:

void ggml_graph_cpy(struct ggml_cgraph * src, struct ggml_cgraph * dst) {
    GGML_ASSERT(dst->size >= src->n_leafs);
    GGML_ASSERT(dst->size >= src->n_nodes);
    GGML_ASSERT(dst->visited_hash_set.size >= src->visited_hash_set.size);

    dst->n_leafs = src->n_leafs;
    dst->n_nodes = src->n_nodes;
    dst->order   = src->order;

    for (int i = 0; i < src->n_leafs; ++i) {
        dst->leafs[i] = src->leafs[i];
    }

    for (int i = 0; i < src->n_nodes; ++i) {
        dst->nodes[i] = src->nodes[i];
    }

    for (size_t i = 0; i < src->visited_hash_set.size; ++i) {
        // copy all hashset keys (tensors) that are in use
        if (ggml_bitset_get(src->visited_hash_set.used, i)) {
            ggml_hash_insert(&dst->visited_hash_set, src->visited_hash_set.keys[i]);
        }
    }

    if (dst->grads) {
        memset(dst->grads,     0, dst->visited_hash_set.size*sizeof(struct ggml_tensor *));
        memset(dst->grad_accs, 0, dst->visited_hash_set.size*sizeof(struct ggml_tensor *));
    }
    if (src->grads) {
        GGML_ASSERT(dst->grads     != NULL);
        GGML_ASSERT(dst->grad_accs != NULL);
        for (int i = 0; i < src->n_nodes; ++i) {
            const size_t igrad_src = ggml_hash_find(&src->visited_hash_set, src->nodes[i]);
            const size_t igrad_dst = ggml_hash_find(&dst->visited_hash_set, dst->nodes[i]);

            GGML_ASSERT(igrad_src != GGML_HASHSET_FULL);
            GGML_ASSERT(ggml_bitset_get(src->visited_hash_set.used, igrad_src));
            GGML_ASSERT(igrad_dst != GGML_HASHSET_FULL);
            GGML_ASSERT(ggml_bitset_get(dst->visited_hash_set.used, igrad_dst));

            dst->grads[igrad_dst]     = src->grads[igrad_src];
            dst->grad_accs[igrad_dst] = src->grad_accs[igrad_src];
        }
    }
}